

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O0

void __thiscall nuraft::buffer::put(buffer *this,buffer *buf)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  overflow_error *this_00;
  byte *__dest;
  byte *__src;
  buffer *in_RSI;
  buffer *in_RDI;
  byte *src;
  byte *d;
  size_t src_p;
  size_t src_sz;
  size_t p;
  size_t sz;
  
  sVar1 = size(in_RDI);
  sVar2 = pos(in_RDI);
  sVar3 = size(in_RSI);
  sVar4 = pos(in_RSI);
  if (sVar1 - sVar2 < sVar3 - sVar4) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"insufficient buffer to hold the other buffer");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  __dest = data(in_RDI);
  __src = data(in_RSI);
  memcpy(__dest,__src,sVar3 - sVar4);
  if ((*(uint *)in_RDI & 0x80000000) == 0) {
    *(short *)(in_RDI + 2) = *(short *)(in_RDI + 2) + ((short)sVar3 - (short)sVar4);
  }
  else {
    *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + ((int)sVar3 - (int)sVar4);
  }
  return;
}

Assistant:

void buffer::put(const buffer& buf) {
    size_t sz = size();
    size_t p = pos();
    size_t src_sz = buf.size();
    size_t src_p = buf.pos();
    if ((sz - p) < (src_sz - src_p)) {
        throw std::overflow_error
              ( "insufficient buffer to hold the other buffer" );
    }

    byte* d = data();
    byte* src = buf.data();
    ::memcpy(d, src, src_sz - src_p);
    __mv_fw_block(this, src_sz - src_p);
}